

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

void png_convert_from_time_t(png_timep ptime,time_t ttime)

{
  tm *ttime_00;
  time_t local_10;
  
  local_10 = ttime;
  ttime_00 = gmtime(&local_10);
  if (ttime_00 == (tm *)0x0) {
    ptime->year = 0;
    ptime->month = '\0';
    ptime->day = '\0';
    ptime->hour = '\0';
    ptime->minute = '\0';
    ptime->second = '\0';
    ptime->field_0x7 = 0;
  }
  else {
    png_convert_from_struct_tm(ptime,(tm *)ttime_00);
  }
  return;
}

Assistant:

void PNGAPI
png_convert_from_time_t(png_timep ptime, time_t ttime)
{
   struct tm *tbuf;

   png_debug(1, "in png_convert_from_time_t");

   tbuf = gmtime(&ttime);
   if (tbuf == NULL)
   {
      /* TODO: add a safe function which takes a png_ptr argument and raises
       * a png_error if the ttime argument is invalid and the call to gmtime
       * fails as a consequence.
       */
      memset(ptime, 0, sizeof(*ptime));
      return;
   }

   png_convert_from_struct_tm(ptime, tbuf);
}